

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O1

Name __thiscall wasm::UniqueNameMapper::getPrefixedName(UniqueNameMapper *this,Name prefix)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  ulong uVar3;
  uint __val;
  IString *this_00;
  bool bVar4;
  char cVar5;
  char cVar6;
  iterator iVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  string_view s;
  undefined1 auStack_c8 [8];
  Name prefix_local;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  undefined1 auStack_88 [8];
  Name ret;
  long *local_70;
  long local_60;
  undefined8 uStack_58;
  size_type *local_50;
  string __str;
  
  prefix_local.super_IString.str._M_len = prefix.super_IString.str._M_str;
  auStack_c8 = prefix.super_IString.str._M_len;
  prefix_local.super_IString.str._M_str = (char *)&this->reverseLabelMapping;
  iVar7 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  *)prefix_local.super_IString.str._M_str,(key_type *)auStack_c8);
  p_Var1 = &(this->reverseLabelMapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
    ret.super_IString.str._M_len = prefix_local.super_IString.str._M_len;
    auStack_88 = auStack_c8;
  }
  else {
    do {
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,prefix_local.super_IString.str._M_len,
                 (long)auStack_c8 + prefix_local.super_IString.str._M_len);
      __val = this->otherIndex;
      this->otherIndex = __val + 1;
      cVar6 = '\x01';
      if (9 < __val) {
        uVar9 = __val;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          if (uVar9 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_00c5de25;
          }
          if (uVar9 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_00c5de25;
          }
          if (uVar9 < 10000) goto LAB_00c5de25;
          bVar4 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (bVar4);
        cVar6 = cVar6 + '\x01';
      }
LAB_00c5de25:
      local_50 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_50,(uint)__str._M_dataplus._M_p,__val);
      uVar10 = 0xf;
      if (local_a8 != local_98) {
        uVar10 = local_98[0];
      }
      uVar3 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_a0;
      if (uVar10 < uVar3) {
        uVar10 = 0xf;
        if (local_50 != &__str._M_string_length) {
          uVar10 = __str._M_string_length;
        }
        if (uVar10 < uVar3) goto LAB_00c5de8d;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_a8);
      }
      else {
LAB_00c5de8d:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_50);
      }
      plVar2 = puVar8 + 2;
      if ((long *)*puVar8 == plVar2) {
        local_60 = *plVar2;
        uStack_58 = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*puVar8;
      }
      this_00 = (IString *)puVar8[1];
      *puVar8 = plVar2;
      puVar8[1] = 0;
      *(undefined1 *)plVar2 = 0;
      s._M_str = (char *)0x0;
      s._M_len = (size_t)local_70;
      _auStack_88 = IString::interned(this_00,s,SUB81(plVar2,0));
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50 != &__str._M_string_length) {
        operator_delete(local_50,__str._M_string_length + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      iVar7 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)prefix_local.super_IString.str._M_str,(key_type *)auStack_88);
    } while ((_Rb_tree_header *)iVar7._M_node != p_Var1);
  }
  return (IString)(IString)_auStack_88;
}

Assistant:

Name UniqueNameMapper::getPrefixedName(Name prefix) {
  if (reverseLabelMapping.find(prefix) == reverseLabelMapping.end()) {
    return prefix;
  }
  // make sure to return a unique name not already on the stack
  while (1) {
    Name ret = prefix.toString() + std::to_string(otherIndex++);
    if (reverseLabelMapping.find(ret) == reverseLabelMapping.end()) {
      return ret;
    }
  }
}